

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_vacuum.cpp
# Opt level: O2

SinkResultType __thiscall
duckdb::PhysicalVacuum::Sink
          (PhysicalVacuum *this,ExecutionContext *context,DataChunk *chunk,OperatorSinkInput *input)

{
  LocalSinkState *pLVar1;
  bool bVar2;
  reference pvVar3;
  reference this_00;
  pointer this_01;
  idx_t col_idx;
  ulong __n;
  
  pLVar1 = input->local_state;
  for (__n = 0; __n < (ulong)(((long)(chunk->data).
                                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(chunk->data).
                                    super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x68);
      __n = __n + 1) {
    pvVar3 = vector<duckdb::Vector,_true>::get<true>(&chunk->data,__n);
    bVar2 = DistinctStatistics::TypeIsSupported(&pvVar3->type);
    if (bVar2) {
      this_00 = vector<duckdb::unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>,_true>
                ::get<true>((vector<duckdb::unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>,_true>
                             *)(pLVar1 + 1),__n);
      this_01 = unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>
                ::operator->(this_00);
      pvVar3 = vector<duckdb::Vector,_true>::get<true>(&chunk->data,__n);
      DistinctStatistics::Update
                (this_01,pvVar3,chunk->count,(Vector *)&pLVar1[1].partition_info.partition_data);
    }
  }
  return NEED_MORE_INPUT;
}

Assistant:

SinkResultType PhysicalVacuum::Sink(ExecutionContext &context, DataChunk &chunk, OperatorSinkInput &input) const {
	auto &lstate = input.local_state.Cast<VacuumLocalSinkState>();
	D_ASSERT(lstate.column_distinct_stats.size() == column_id_map.size());

	for (idx_t col_idx = 0; col_idx < chunk.data.size(); col_idx++) {
		if (!DistinctStatistics::TypeIsSupported(chunk.data[col_idx].GetType())) {
			continue;
		}
		lstate.column_distinct_stats[col_idx]->Update(chunk.data[col_idx], chunk.size(), lstate.hashes);
	}

	return SinkResultType::NEED_MORE_INPUT;
}